

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

void unshuffle64(LONGLONG *a,int n,int n2,LONGLONG *tmp)

{
  bool bVar1;
  long lVar2;
  LONGLONG *pLVar3;
  int iVar4;
  int iVar5;
  LONGLONG *pLVar6;
  long lVar7;
  
  iVar4 = n + 1 >> 1;
  lVar2 = (long)n2;
  if (iVar4 < n) {
    pLVar3 = a + iVar4 * n2;
    lVar7 = 0;
    do {
      tmp[lVar7] = *pLVar3;
      lVar7 = lVar7 + 1;
      pLVar3 = pLVar3 + lVar2;
    } while (n - iVar4 != (int)lVar7);
  }
  if (0 < iVar4) {
    iVar5 = (iVar4 + -1) * n2;
    pLVar3 = a + iVar5 * 2;
    pLVar6 = a + iVar5;
    do {
      *pLVar3 = *pLVar6;
      pLVar6 = pLVar6 + -lVar2;
      pLVar3 = pLVar3 + -(long)(n2 * 2);
      iVar5 = iVar4 + -1;
      bVar1 = 0 < iVar4;
      iVar4 = iVar5;
    } while (iVar5 != 0 && bVar1);
  }
  if (1 < n) {
    pLVar3 = a + lVar2;
    lVar2 = 0;
    do {
      *pLVar3 = *(LONGLONG *)((long)tmp + lVar2 * 4);
      pLVar3 = pLVar3 + n2 * 2;
      iVar4 = (int)lVar2;
      lVar2 = lVar2 + 2;
    } while (iVar4 + 3 < n);
  }
  return;
}

Assistant:

static void
unshuffle64(LONGLONG a[], int n, int n2, LONGLONG tmp[])
/*
LONGLONG a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
LONGLONG tmp[];	 scratch storage					
*/
{
int i;
int nhalf;
LONGLONG *p1, *p2, *pt;
 
	/*
	 * copy 2nd half of array to tmp
	 */
	nhalf = (n+1)>>1;
	pt = tmp;
	p1 = &a[n2*nhalf];				/* pointer to a[i]			*/
	for (i=nhalf; i<n; i++) {
		*pt = *p1;
		p1 += n2;
		pt += 1;
	}
	/*
	 * distribute 1st half of array to even elements
	 */
	p2 = &a[ n2*(nhalf-1) ];		/* pointer to a[i]			*/
	p1 = &a[(n2*(nhalf-1))<<1];		/* pointer to a[2*i]		*/
	for (i=nhalf-1; i >= 0; i--) {
		*p1 = *p2;
		p2 -= n2;
		p1 -= (n2+n2);
	}
	/*
	 * now distribute 2nd half of array (in tmp) to odd elements
	 */
	pt = tmp;
	p1 = &a[n2];					/* pointer to a[i]			*/
	for (i=1; i<n; i += 2) {
		*p1 = *pt;
		p1 += (n2+n2);
		pt += 1;
	}
}